

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int SSL_peek(SSL *ssl,void *buf,int num)

{
  ulong uVar1;
  uint uVar2;
  ulong __n;
  
  if (ssl->msg_callback == (_func_3150 *)0x0) {
    __n = (ulong)(uint)num;
    uVar2 = ssl_read_impl((SSL *)ssl);
    if ((int)uVar2 < 1) {
      __n = (ulong)uVar2;
    }
    else if (0 < num) {
      uVar1 = *(ulong *)(ssl->handshake_func + 0x88);
      __n = (ulong)(uint)num;
      if (uVar1 < (uint)num) {
        __n = uVar1;
      }
      if (uVar1 != 0) {
        memcpy(buf,*(void **)(ssl->handshake_func + 0x80),__n);
      }
    }
  }
  else {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x39d);
    __n = 0xffffffff;
  }
  return (int)__n;
}

Assistant:

int SSL_peek(SSL *ssl, void *buf, int num) {
  if (SSL_is_quic(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return -1;
  }

  int ret = ssl_read_impl(ssl);
  if (ret <= 0) {
    return ret;
  }
  if (num <= 0) {
    return num;
  }
  size_t todo =
      std::min(ssl->s3->pending_app_data.size(), static_cast<size_t>(num));
  OPENSSL_memcpy(buf, ssl->s3->pending_app_data.data(), todo);
  return static_cast<int>(todo);
}